

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_array_delete(hd_context *ctx,pdf_obj *obj,int i)

{
  char *pcVar1;
  pdf_obj *ppStack_18;
  int i_local;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  ppStack_18 = obj;
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    ppStack_18 = pdf_resolve_indirect_chain(ctx,obj);
  }
  if (((pdf_obj *)0x188 < ppStack_18) && (ppStack_18->kind == 'a')) {
    if ((-1 < i) && (i < (int)ppStack_18[5])) {
      prepare_object_for_alteration(ctx,ppStack_18,(pdf_obj *)0x0);
      pdf_drop_obj(ctx,*(pdf_obj **)(*(long *)(ppStack_18 + 8) + (long)i * 8));
      *(undefined8 *)(*(long *)(ppStack_18 + 8) + (long)i * 8) = 0;
      ppStack_18[5] = (pdf_obj)((int)ppStack_18[5] + -1);
      memmove((void *)(*(long *)(ppStack_18 + 8) + (long)i * 8),
              (void *)(*(long *)(ppStack_18 + 8) + (long)i * 8 + 8),
              (long)((int)ppStack_18[5] - i) << 3);
      return;
    }
    hd_throw(ctx,2,"index out of bounds");
  }
  pcVar1 = pdf_objkindstr(ppStack_18);
  hd_throw(ctx,2,"not an array (%s)",pcVar1);
}

Assistant:

void
pdf_array_delete(hd_context *ctx, pdf_obj *obj, int i)
{
    RESOLVE(obj);
    if (!OBJ_IS_ARRAY(obj))
        hd_throw(ctx, HD_ERROR_GENERIC, "not an array (%s)", pdf_objkindstr(obj));
    if (i < 0 || i >= ARRAY(obj)->len)
        hd_throw(ctx, HD_ERROR_GENERIC, "index out of bounds");

    prepare_object_for_alteration(ctx, obj, NULL);
    pdf_drop_obj(ctx, ARRAY(obj)->items[i]);
    ARRAY(obj)->items[i] = 0;
    ARRAY(obj)->len--;
    memmove(ARRAY(obj)->items + i, ARRAY(obj)->items + i + 1, (ARRAY(obj)->len - i) * sizeof(pdf_obj*));
}